

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coleitr.cpp
# Opt level: O0

void __thiscall
icu_63::CollationElementIterator::setOffset
          (CollationElementIterator *this,int32_t newOffset,UErrorCode *status)

{
  RuleBasedCollator *this_00;
  UBool UVar1;
  char16_t cVar2;
  int32_t iVar3;
  UChar32 c_00;
  uint uVar4;
  uint local_2c;
  int32_t lastSafeOffset;
  UChar c;
  int32_t offset;
  UErrorCode *status_local;
  int32_t newOffset_local;
  CollationElementIterator *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    status_local._4_4_ = newOffset;
    if ((0 < newOffset) &&
       (iVar3 = UnicodeString::length(&this->string_), lastSafeOffset = newOffset, newOffset < iVar3
       )) {
      do {
        cVar2 = UnicodeString::charAt(&this->string_,lastSafeOffset);
        UVar1 = RuleBasedCollator::isUnsafe(this->rbc_,(uint)(ushort)cVar2);
        if (UVar1 == '\0') break;
        if ((cVar2 & 0xfc00U) == 0xd800) {
          this_00 = this->rbc_;
          c_00 = UnicodeString::char32At(&this->string_,lastSafeOffset);
          UVar1 = RuleBasedCollator::isUnsafe(this_00,c_00);
          if (UVar1 == '\0') break;
        }
        lastSafeOffset = lastSafeOffset + -1;
      } while (0 < lastSafeOffset);
      if (lastSafeOffset < newOffset) {
        local_2c = lastSafeOffset;
        do {
          (*(this->iter_->super_UObject)._vptr_UObject[4])(this->iter_,(ulong)local_2c);
          do {
            CollationIterator::nextCE(this->iter_,status);
            UVar1 = ::U_FAILURE(*status);
            if (UVar1 != '\0') {
              return;
            }
            uVar4 = (*(this->iter_->super_UObject)._vptr_UObject[5])();
          } while (uVar4 == local_2c);
          if ((int)uVar4 <= newOffset) {
            local_2c = uVar4;
          }
        } while ((int)uVar4 < newOffset);
        status_local._4_4_ = local_2c;
      }
    }
    (*(this->iter_->super_UObject)._vptr_UObject[4])(this->iter_,(ulong)status_local._4_4_);
    this->otherHalf_ = 0;
    this->dir_ = '\x01';
  }
  return;
}

Assistant:

void CollationElementIterator::setOffset(int32_t newOffset, 
                                         UErrorCode& status)
{
    if (U_FAILURE(status)) { return; }
    if (0 < newOffset && newOffset < string_.length()) {
        int32_t offset = newOffset;
        do {
            UChar c = string_.charAt(offset);
            if (!rbc_->isUnsafe(c) ||
                    (U16_IS_LEAD(c) && !rbc_->isUnsafe(string_.char32At(offset)))) {
                break;
            }
            // Back up to before this unsafe character.
            --offset;
        } while (offset > 0);
        if (offset < newOffset) {
            // We might have backed up more than necessary.
            // For example, contractions "ch" and "cu" make both 'h' and 'u' unsafe,
            // but for text "chu" setOffset(2) should remain at 2
            // although we initially back up to offset 0.
            // Find the last safe offset no greater than newOffset by iterating forward.
            int32_t lastSafeOffset = offset;
            do {
                iter_->resetToOffset(lastSafeOffset);
                do {
                    iter_->nextCE(status);
                    if (U_FAILURE(status)) { return; }
                } while ((offset = iter_->getOffset()) == lastSafeOffset);
                if (offset <= newOffset) {
                    lastSafeOffset = offset;
                }
            } while (offset < newOffset);
            newOffset = lastSafeOffset;
        }
    }
    iter_->resetToOffset(newOffset);
    otherHalf_ = 0;
    dir_ = 1;
}